

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_read_eoc(opj_j2k_t *j2k)

{
  byte *pbVar1;
  int iVar2;
  opj_bool oVar3;
  opj_cp_t *poVar4;
  opj_tcd_t *tcd;
  long lVar5;
  
  if (j2k->cp->limit_decoding == DECODE_ALL_BUT_PACKETS) {
    poVar4 = j2k->cp;
    if (0 < poVar4->tileno_size) {
      lVar5 = 0;
      do {
        iVar2 = poVar4->tileno[lVar5];
        free(j2k->tile_data[iVar2]);
        j2k->tile_data[iVar2] = (uchar *)0x0;
        lVar5 = lVar5 + 1;
        poVar4 = j2k->cp;
      } while (lVar5 < poVar4->tileno_size);
    }
  }
  else {
    tcd = tcd_create(j2k->cinfo);
    tcd_malloc_decode(tcd,j2k->image,j2k->cp);
    poVar4 = j2k->cp;
    if (0 < poVar4->tileno_size) {
      lVar5 = 0;
      do {
        tcd_malloc_decode_tile(tcd,j2k->image,poVar4,(int)lVar5,j2k->cstr_info);
        iVar2 = j2k->cp->tileno[lVar5];
        oVar3 = tcd_decode_tile(tcd,j2k->tile_data[iVar2],j2k->tile_len[iVar2],iVar2,j2k->cstr_info)
        ;
        free(j2k->tile_data[iVar2]);
        j2k->tile_data[iVar2] = (uchar *)0x0;
        tcd_free_decode_tile(tcd,(int)lVar5);
        if (oVar3 == 0) {
          pbVar1 = (byte *)((long)&j2k->state + 1);
          *pbVar1 = *pbVar1 | 0x80;
          break;
        }
        lVar5 = lVar5 + 1;
        poVar4 = j2k->cp;
      } while (lVar5 < poVar4->tileno_size);
    }
    tcd_free_decode(tcd);
    tcd_destroy(tcd);
  }
  j2k->state = j2k->state & 0x8000U | 0x20;
  return;
}

Assistant:

static void j2k_read_eoc(opj_j2k_t *j2k) {
	int i, tileno;
	opj_bool success;

	/* if packets should be decoded */
	if (j2k->cp->limit_decoding != DECODE_ALL_BUT_PACKETS) {
		opj_tcd_t *tcd = tcd_create(j2k->cinfo);
		tcd_malloc_decode(tcd, j2k->image, j2k->cp);
		for (i = 0; i < j2k->cp->tileno_size; i++) {
			tcd_malloc_decode_tile(tcd, j2k->image, j2k->cp, i, j2k->cstr_info);
			tileno = j2k->cp->tileno[i];
			success = tcd_decode_tile(tcd, j2k->tile_data[tileno], j2k->tile_len[tileno], tileno, j2k->cstr_info);
			opj_free(j2k->tile_data[tileno]);
			j2k->tile_data[tileno] = NULL;
			tcd_free_decode_tile(tcd, i);
			if (success == OPJ_FALSE) {
				j2k->state |= J2K_STATE_ERR;
				break;
			}
		}
		tcd_free_decode(tcd);
		tcd_destroy(tcd);
	}
	/* if packets should not be decoded  */
	else {
		for (i = 0; i < j2k->cp->tileno_size; i++) {
			tileno = j2k->cp->tileno[i];
			opj_free(j2k->tile_data[tileno]);
			j2k->tile_data[tileno] = NULL;
		}
	}	
	if (j2k->state & J2K_STATE_ERR)
		j2k->state = J2K_STATE_MT + J2K_STATE_ERR;
	else
		j2k->state = J2K_STATE_MT; 
}